

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Eigenvalue.hpp
# Opt level: O0

void __thiscall JAMA::Eigenvalue<double>::hqr2(Eigenvalue<double> *this)

{
  double *pdVar1;
  reference pvVar2;
  uint *puVar3;
  value_type vVar4;
  int *piVar5;
  double dVar6;
  int iVar7;
  uint *in_RDI;
  DynamicRectMatrix<double> *pDVar8;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double dVar9;
  double __x;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double extraout_XMM0_Qa_05;
  double extraout_XMM0_Qa_06;
  double dVar10;
  double extraout_XMM0_Qa_07;
  double extraout_XMM0_Qa_08;
  double extraout_XMM0_Qa_09;
  double extraout_XMM0_Qa_10;
  double extraout_XMM0_Qa_11;
  double extraout_XMM0_Qa_12;
  double extraout_XMM0_Qa_13;
  double extraout_XMM0_Qa_14;
  double extraout_XMM0_Qa_15;
  double extraout_XMM0_Qa_16;
  double extraout_XMM0_Qa_17;
  double extraout_XMM0_Qa_18;
  double extraout_XMM0_Qa_19;
  double extraout_XMM0_Qa_20;
  double extraout_XMM0_Qa_21;
  double extraout_XMM0_Qa_22;
  double extraout_XMM0_Qa_23;
  double extraout_XMM0_Qa_24;
  double extraout_XMM0_Qa_25;
  double extraout_XMM0_Qa_26;
  double extraout_XMM0_Qa_27;
  double extraout_XMM0_Qa_28;
  double extraout_XMM0_Qa_29;
  double extraout_XMM0_Qa_30;
  double extraout_XMM0_Qa_31;
  double extraout_XMM0_Qa_32;
  double dVar11;
  int k_1;
  int i_11;
  int j_8;
  int j_7;
  int i_10;
  int j_6;
  int j_5;
  double vi;
  double vr;
  double sa;
  double ra;
  int i_9;
  int l_2;
  int j_4;
  int j_3;
  int i_8;
  int l_1;
  int i_7;
  int i_6;
  int j_2;
  int notlast;
  int k;
  int i_5;
  int m;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int j_1;
  int l;
  int iter;
  int j;
  int i;
  double norm;
  double y;
  double x;
  double w;
  double t;
  double z;
  double s;
  double r;
  double q;
  double p;
  double exshift;
  double eps;
  int high;
  int low;
  int n;
  int nn;
  size_type in_stack_fffffffffffffa58;
  DynamicVector<double,_std::allocator<double>_> *in_stack_fffffffffffffa60;
  double in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa78;
  undefined4 in_stack_fffffffffffffa7c;
  uint uVar12;
  double in_stack_fffffffffffffa80;
  double in_stack_fffffffffffffa88;
  Eigenvalue<double> *in_stack_fffffffffffffa90;
  double local_2d0;
  uint local_130;
  uint local_12c;
  uint local_128;
  uint local_124;
  uint local_120;
  uint local_11c;
  double local_118;
  double local_110;
  uint local_104;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  int local_c0;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  uint local_b0;
  uint local_ac;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  uint local_98;
  uint local_94;
  uint local_90;
  int local_8c;
  int local_88;
  int local_84;
  uint local_80;
  uint local_7c;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  value_type local_50;
  double local_48;
  double local_40;
  double local_38;
  value_type local_30;
  double local_28;
  double local_20;
  int local_18;
  uint local_14;
  uint local_10;
  uint local_c;
  
  local_c = *in_RDI;
  local_10 = local_c - 1;
  local_14 = 0;
  local_18 = local_c - 1;
  local_20 = pow(2.0,-52.0);
  local_28 = 0.0;
  local_30 = 0.0;
  local_38 = 0.0;
  local_40 = 0.0;
  local_48 = 0.0;
  local_50 = 0.0;
  local_78 = 0.0;
  for (local_7c = 0; (int)local_7c < (int)local_c; local_7c = local_7c + 1) {
    if (((int)local_7c < (int)local_14) || (local_18 < (int)local_7c)) {
      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_7c,local_7c);
      dVar9 = *pdVar1;
      pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                         (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
      *pvVar2 = dVar9;
      pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                         (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
      *pvVar2 = 0.0;
    }
    local_84 = local_7c - 1;
    local_88 = 0;
    puVar3 = (uint *)std::max<int>(&local_84,&local_88);
    for (local_80 = *puVar3; dVar9 = local_78, (int)local_80 < (int)local_c; local_80 = local_80 + 1
        ) {
      pDVar8 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
      OpenMD::DynamicRectMatrix<double>::operator()(pDVar8,local_7c,local_80);
      std::abs((int)pDVar8);
      local_78 = dVar9 + extraout_XMM0_Qa;
    }
  }
  local_8c = 0;
LAB_0033952b:
  do {
    if ((int)local_10 < (int)local_14) {
      local_10 = local_c;
      if ((local_78 != 0.0) || (NAN(local_78))) {
        while (local_10 = local_10 - 1, -1 < (int)local_10) {
          pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
          local_30 = *pvVar2;
          pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
          local_38 = *pvVar2;
          if ((local_38 != 0.0) || (NAN(local_38))) {
            if (local_38 < 0.0) {
              local_d8 = local_10 - 1;
              pDVar8 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
              OpenMD::DynamicRectMatrix<double>::operator()(pDVar8,local_10,local_10 - 1);
              std::abs((int)pDVar8);
              pDVar8 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
              OpenMD::DynamicRectMatrix<double>::operator()(pDVar8,local_10 - 1,local_10);
              std::abs((int)pDVar8);
              dVar9 = local_38;
              if (extraout_XMM0_Qa_23 <= extraout_XMM0_Qa_24) {
                OpenMD::DynamicRectMatrix<double>::operator()
                          ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10 - 1,local_10);
                OpenMD::DynamicRectMatrix<double>::operator()
                          ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10 - 1,local_10 - 1);
                cdiv(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                     (double)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                     in_stack_fffffffffffffa70);
                dVar9 = *(double *)(in_RDI + 0x1c);
                pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                   ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10 - 1,
                                    local_10 - 1);
                *pdVar1 = dVar9;
                dVar9 = *(double *)(in_RDI + 0x1e);
                pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                   ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10 - 1,
                                    local_10);
                *pdVar1 = dVar9;
              }
              else {
                pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                   ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10,
                                    local_10 - 1);
                dVar11 = *pdVar1;
                pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                   ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10 - 1,
                                    local_10 - 1);
                *pdVar1 = dVar9 / dVar11;
                pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                   ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10,local_10);
                dVar11 = *pdVar1 - local_30;
                pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                   ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10,
                                    local_10 - 1);
                dVar9 = *pdVar1;
                pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                   ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10 - 1,
                                    local_10);
                *pdVar1 = -dVar11 / dVar9;
              }
              pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                 ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10,local_10 - 1
                                 );
              *pdVar1 = 0.0;
              pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                 ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10,local_10);
              *pdVar1 = 1.0;
              for (local_dc = local_10 - 2; -1 < (int)local_dc; local_dc = local_dc - 1) {
                local_e8 = 0.0;
                local_f0 = 0.0;
                for (local_104 = local_d8; dVar9 = local_e8, (int)local_104 <= (int)local_10;
                    local_104 = local_104 + 1) {
                  pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                     ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_dc,
                                      local_104);
                  dVar11 = *pdVar1;
                  pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                     ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_104,
                                      local_10 - 1);
                  dVar10 = local_f0;
                  local_e8 = dVar11 * *pdVar1 + dVar9;
                  pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                     ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_dc,
                                      local_104);
                  dVar9 = *pdVar1;
                  pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                     ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_104,
                                      local_10);
                  local_f0 = dVar9 * *pdVar1 + dVar10;
                }
                pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                   ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_dc,local_dc);
                local_60 = *pdVar1 - local_30;
                pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                                   (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
                if (0.0 < *pvVar2 || *pvVar2 == 0.0) {
                  local_d8 = local_dc;
                  pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                                     (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
                  if ((*pvVar2 != 0.0) || (NAN(*pvVar2))) {
                    pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                       ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_dc,
                                        local_dc + 1);
                    local_68 = *pdVar1;
                    pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                       ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_dc + 1,
                                        local_dc);
                    local_70 = *pdVar1;
                    pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                                       (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
                    dVar11 = *pvVar2 - local_30;
                    pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                                       (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
                    dVar10 = *pvVar2 - local_30;
                    pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                                       (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
                    dVar9 = *pvVar2;
                    pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                                       (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
                    local_f8 = -local_38 * local_38 + dVar11 * dVar10 + dVar9 * *pvVar2;
                    iVar7 = (int)in_RDI + 8;
                    pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                                       (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
                    local_100 = (*pvVar2 - local_30) * 2.0 * local_38;
                    if ((local_f8 == 0.0) &&
                       (((!NAN(local_f8) && (local_100 == 0.0)) && (!NAN(local_100))))) {
                      dVar9 = local_20 * local_78;
                      std::abs(iVar7);
                      std::abs(iVar7);
                      std::abs(iVar7);
                      std::abs(iVar7);
                      std::abs(iVar7);
                      local_f8 = dVar9 * (extraout_XMM0_Qa_25 + extraout_XMM0_Qa_26 +
                                          extraout_XMM0_Qa_27 + extraout_XMM0_Qa_28 +
                                         extraout_XMM0_Qa_29);
                    }
                    cdiv(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                         in_stack_fffffffffffffa80,
                         (double)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                         in_stack_fffffffffffffa70);
                    dVar9 = *(double *)(in_RDI + 0x1c);
                    pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                       ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_dc,
                                        local_10 - 1);
                    *pdVar1 = dVar9;
                    dVar9 = *(double *)(in_RDI + 0x1e);
                    pDVar8 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
                    pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()(pDVar8,local_dc,local_10)
                    ;
                    *pdVar1 = dVar9;
                    iVar7 = (int)pDVar8;
                    std::abs(iVar7);
                    std::abs(iVar7);
                    std::abs(iVar7);
                    dVar9 = local_60;
                    if (extraout_XMM0_Qa_30 <= extraout_XMM0_Qa_31 + extraout_XMM0_Qa_32) {
                      OpenMD::DynamicRectMatrix<double>::operator()
                                ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_dc,local_10 - 1)
                      ;
                      OpenMD::DynamicRectMatrix<double>::operator()
                                ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_dc,local_10);
                      cdiv(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                           in_stack_fffffffffffffa80,
                           (double)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                           in_stack_fffffffffffffa70);
                      dVar9 = *(double *)(in_RDI + 0x1c);
                      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_dc + 1,
                                          local_10 - 1);
                      *pdVar1 = dVar9;
                      dVar9 = *(double *)(in_RDI + 0x1e);
                      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_dc + 1,
                                          local_10);
                      *pdVar1 = dVar9;
                    }
                    else {
                      dVar6 = -local_e8;
                      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_dc,
                                          local_10 - 1);
                      dVar10 = local_38;
                      dVar11 = *pdVar1;
                      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_dc,
                                          local_10);
                      dVar9 = (dVar10 * *pdVar1 + -dVar9 * dVar11 + dVar6) / local_68;
                      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_dc + 1,
                                          local_10 - 1);
                      dVar11 = local_60;
                      *pdVar1 = dVar9;
                      dVar6 = -local_f0;
                      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_dc,
                                          local_10);
                      dVar10 = local_38;
                      dVar9 = *pdVar1;
                      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_dc,
                                          local_10 - 1);
                      dVar9 = (-dVar10 * *pdVar1 + -dVar11 * dVar9 + dVar6) / local_68;
                      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_dc + 1,
                                          local_10);
                      *pdVar1 = dVar9;
                    }
                  }
                  else {
                    cdiv(in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
                         in_stack_fffffffffffffa80,
                         (double)CONCAT44(in_stack_fffffffffffffa7c,in_stack_fffffffffffffa78),
                         in_stack_fffffffffffffa70);
                    dVar9 = *(double *)(in_RDI + 0x1c);
                    pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                       ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_dc,
                                        local_10 - 1);
                    *pdVar1 = dVar9;
                    dVar9 = *(double *)(in_RDI + 0x1e);
                    pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                       ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_dc,
                                        local_10);
                    *pdVar1 = dVar9;
                  }
                  pDVar8 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
                  OpenMD::DynamicRectMatrix<double>::operator()(pDVar8,local_dc,local_10 - 1);
                  std::abs((int)pDVar8);
                  pDVar8 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
                  OpenMD::DynamicRectMatrix<double>::operator()(pDVar8,local_dc,local_10);
                  std::abs((int)pDVar8);
                  pdVar1 = std::max<double>(&local_110,&local_118);
                  local_58 = *pdVar1;
                  if (1.0 < local_20 * local_58 * local_58) {
                    for (local_11c = local_dc; (int)local_11c <= (int)local_10;
                        local_11c = local_11c + 1) {
                      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_11c,
                                          local_10 - 1);
                      in_stack_fffffffffffffa88 = *pdVar1 / local_58;
                      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_11c,
                                          local_10 - 1);
                      *pdVar1 = in_stack_fffffffffffffa88;
                      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_11c,
                                          local_10);
                      in_stack_fffffffffffffa90 = (Eigenvalue<double> *)(*pdVar1 / local_58);
                      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_11c,
                                          local_10);
                      *pdVar1 = (double)in_stack_fffffffffffffa90;
                    }
                  }
                }
                else {
                  local_50 = local_60;
                  local_40 = local_e8;
                  local_48 = local_f0;
                }
              }
            }
          }
          else {
            local_c8 = local_10;
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10,local_10);
            *pdVar1 = 1.0;
            local_cc = local_10;
            while (local_cc = local_cc - 1, -1 < (int)local_cc) {
              pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                 ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_cc,local_cc);
              local_60 = *pdVar1 - local_30;
              local_40 = 0.0;
              for (local_d0 = local_c8; dVar9 = local_40, (int)local_d0 <= (int)local_10;
                  local_d0 = local_d0 + 1) {
                pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                   ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_cc,local_d0);
                dVar11 = *pdVar1;
                pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                   ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_d0,local_10);
                local_40 = dVar11 * *pdVar1 + dVar9;
              }
              pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                                 (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
              if (0.0 < *pvVar2 || *pvVar2 == 0.0) {
                local_c8 = local_cc;
                pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                                   (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
                if ((*pvVar2 != 0.0) || (NAN(*pvVar2))) {
                  pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                     ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_cc,
                                      local_cc + 1);
                  local_68 = *pdVar1;
                  pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                     ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_cc + 1,
                                      local_cc);
                  local_70 = *pdVar1;
                  pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                                     (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
                  dVar11 = *pvVar2 - local_30;
                  pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                                     (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
                  dVar10 = *pvVar2 - local_30;
                  pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                                     (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
                  dVar9 = *pvVar2;
                  pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                                     (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
                  local_38 = dVar11 * dVar10 + dVar9 * *pvVar2;
                  dVar9 = (local_68 * local_48 + -(local_50 * local_40)) / local_38;
                  pDVar8 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
                  local_58 = dVar9;
                  pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()(pDVar8,local_cc,local_10);
                  *pdVar1 = dVar9;
                  iVar7 = (int)pDVar8;
                  std::abs(iVar7);
                  std::abs(iVar7);
                  if (extraout_XMM0_Qa_20 <= extraout_XMM0_Qa_21) {
                    dVar9 = (-local_70 * local_58 + -local_48) / local_50;
                    pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                       ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_cc + 1,
                                        local_10);
                    *pdVar1 = dVar9;
                  }
                  else {
                    dVar9 = (-local_60 * local_58 + -local_40) / local_68;
                    pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                       ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_cc + 1,
                                        local_10);
                    *pdVar1 = dVar9;
                  }
                }
                else if ((local_60 != 0.0) || (NAN(local_60))) {
                  dVar9 = -local_40 / local_60;
                  pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                     ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_cc,local_10
                                     );
                  *pdVar1 = dVar9;
                }
                else {
                  dVar9 = -local_40;
                  dVar11 = local_20 * local_78;
                  pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                     ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_cc,local_10
                                     );
                  *pdVar1 = dVar9 / dVar11;
                }
                pDVar8 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
                OpenMD::DynamicRectMatrix<double>::operator()(pDVar8,local_cc,local_10);
                std::abs((int)pDVar8);
                local_58 = extraout_XMM0_Qa_22;
                if (1.0 < local_20 * extraout_XMM0_Qa_22 * extraout_XMM0_Qa_22) {
                  for (local_d4 = local_cc; (int)local_d4 <= (int)local_10; local_d4 = local_d4 + 1)
                  {
                    pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                       ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_d4,
                                        local_10);
                    dVar9 = *pdVar1 / local_58;
                    pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                       ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_d4,
                                        local_10);
                    *pdVar1 = dVar9;
                  }
                }
              }
              else {
                local_50 = local_60;
                local_48 = local_40;
              }
            }
          }
        }
        for (local_120 = 0; local_128 = local_c, (int)local_120 < (int)local_c;
            local_120 = local_120 + 1) {
          if (((int)local_120 < (int)local_14) || (local_18 < (int)local_120)) {
            for (local_124 = local_120; (int)local_124 < (int)local_c; local_124 = local_124 + 1) {
              pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                 ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_120,local_124);
              dVar9 = *pdVar1;
              pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                 ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_120,local_124);
              *pdVar1 = dVar9;
            }
          }
        }
        while (local_128 = local_128 - 1, (int)local_14 <= (int)local_128) {
          for (local_12c = local_14; (int)local_12c <= local_18; local_12c = local_12c + 1) {
            local_50 = 0.0;
            local_130 = local_14;
            while (uVar12 = local_130, piVar5 = std::min<int>((int *)&local_128,&local_18),
                  (int)uVar12 <= *piVar5) {
              vVar4 = local_50;
              pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                 ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_12c,local_130);
              dVar9 = *pdVar1;
              pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                 ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_130,local_128);
              local_50 = dVar9 * *pdVar1 + vVar4;
              local_130 = local_130 + 1;
            }
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_12c,local_128);
            *pdVar1 = local_50;
          }
        }
      }
      return;
    }
    for (local_90 = local_10; (int)local_14 < (int)local_90; local_90 = local_90 - 1) {
      pDVar8 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
      OpenMD::DynamicRectMatrix<double>::operator()(pDVar8,local_90 - 1,local_90 - 1);
      std::abs((int)pDVar8);
      pDVar8 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
      OpenMD::DynamicRectMatrix<double>::operator()(pDVar8,local_90,local_90);
      std::abs((int)pDVar8);
      local_48 = extraout_XMM0_Qa_00 + extraout_XMM0_Qa_01;
      if ((local_48 == 0.0) && (!NAN(local_48))) {
        local_48 = local_78;
      }
      pDVar8 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
      OpenMD::DynamicRectMatrix<double>::operator()(pDVar8,local_90,local_90 - 1);
      std::abs((int)pDVar8);
      if (extraout_XMM0_Qa_02 < local_20 * local_48) break;
    }
    if (local_90 == local_10) {
      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10,local_10);
      dVar9 = *pdVar1 + local_28;
      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10,local_10);
      *pdVar1 = dVar9;
      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10,local_10);
      dVar9 = *pdVar1;
      pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                         (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
      *pvVar2 = dVar9;
      pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                         (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
      *pvVar2 = 0.0;
      local_10 = local_10 - 1;
      local_8c = 0;
      goto LAB_0033952b;
    }
    if (local_90 == local_10 - 1) {
      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10,local_10 - 1);
      dVar9 = *pdVar1;
      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10 - 1,local_10);
      local_60 = dVar9 * *pdVar1;
      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10 - 1,local_10 - 1);
      dVar9 = *pdVar1;
      pDVar8 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()(pDVar8,local_10,local_10);
      local_30 = (dVar9 - *pdVar1) / 2.0;
      local_38 = local_30 * local_30 + local_60;
      std::abs((int)pDVar8);
      local_50 = sqrt(__x);
      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10,local_10);
      dVar9 = *pdVar1 + local_28;
      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10,local_10);
      *pdVar1 = dVar9;
      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10 - 1,local_10 - 1);
      dVar9 = *pdVar1 + local_28;
      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10 - 1,local_10 - 1);
      *pdVar1 = dVar9;
      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10,local_10);
      local_68 = *pdVar1;
      if (local_38 < 0.0) {
        dVar9 = local_68 + local_30;
        pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
        *pvVar2 = dVar9;
        dVar9 = local_68 + local_30;
        pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
        vVar4 = local_50;
        *pvVar2 = dVar9;
        pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
        *pvVar2 = vVar4;
        vVar4 = -local_50;
        pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
        *pvVar2 = vVar4;
      }
      else {
        if (local_30 < 0.0) {
          local_50 = local_30 - local_50;
        }
        else {
          local_50 = local_30 + local_50;
        }
        dVar9 = local_68 + local_50;
        pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
        *pvVar2 = dVar9;
        pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
        vVar4 = *pvVar2;
        pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
        *pvVar2 = vVar4;
        if ((local_50 != 0.0) || (NAN(local_50))) {
          dVar9 = local_68 - local_60 / local_50;
          pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                             (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
          *pvVar2 = dVar9;
        }
        pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
        *pvVar2 = 0.0;
        pvVar2 = OpenMD::DynamicVector<double,_std::allocator<double>_>::operator()
                           (in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
        *pvVar2 = 0.0;
        pDVar8 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
        pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()(pDVar8,local_10,local_10 - 1);
        local_68 = *pdVar1;
        iVar7 = (int)pDVar8;
        std::abs(iVar7);
        std::abs(iVar7);
        local_48 = extraout_XMM0_Qa_03 + extraout_XMM0_Qa_04;
        local_30 = local_68 / local_48;
        local_38 = local_50 / local_48;
        local_40 = sqrt(local_30 * local_30 + local_38 * local_38);
        local_30 = local_30 / local_40;
        local_38 = local_38 / local_40;
        for (local_94 = local_10 - 1; (int)local_94 < (int)local_c; local_94 = local_94 + 1) {
          pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10 - 1,local_94);
          vVar4 = local_30;
          dVar10 = local_38;
          dVar9 = *pdVar1;
          local_50 = dVar9;
          pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10,local_94);
          dVar11 = *pdVar1;
          pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10 - 1,local_94);
          dVar6 = local_38;
          *pdVar1 = dVar10 * dVar9 + vVar4 * dVar11;
          pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10,local_94);
          dVar9 = *pdVar1;
          dVar11 = local_30 * local_50;
          pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10,local_94);
          *pdVar1 = dVar6 * dVar9 + -dVar11;
        }
        for (local_98 = 0; (int)local_98 <= (int)local_10; local_98 = local_98 + 1) {
          pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_98,local_10 - 1);
          vVar4 = local_30;
          dVar10 = local_38;
          dVar9 = *pdVar1;
          local_50 = dVar9;
          pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_98,local_10);
          dVar11 = *pdVar1;
          pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_98,local_10 - 1);
          dVar6 = local_38;
          *pdVar1 = dVar10 * dVar9 + vVar4 * dVar11;
          pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_98,local_10);
          dVar9 = *pdVar1;
          dVar11 = local_30 * local_50;
          pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_98,local_10);
          *pdVar1 = dVar6 * dVar9 + -dVar11;
        }
        for (local_9c = local_14; (int)local_9c <= local_18; local_9c = local_9c + 1) {
          pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_9c,local_10 - 1);
          vVar4 = local_30;
          dVar10 = local_38;
          dVar9 = *pdVar1;
          local_50 = dVar9;
          pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_9c,local_10);
          dVar11 = *pdVar1;
          pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_9c,local_10 - 1);
          dVar6 = local_38;
          *pdVar1 = dVar10 * dVar9 + vVar4 * dVar11;
          pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_9c,local_10);
          dVar9 = *pdVar1;
          dVar11 = local_30 * local_50;
          pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_9c,local_10);
          *pdVar1 = dVar6 * dVar9 + -dVar11;
        }
      }
      local_10 = local_10 - 2;
      local_8c = 0;
    }
    else {
      pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                         ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10,local_10);
      local_68 = *pdVar1;
      local_70 = 0.0;
      local_60 = 0.0;
      if ((int)local_90 < (int)local_10) {
        pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10 - 1,local_10 - 1);
        local_70 = *pdVar1;
        pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10,local_10 - 1);
        dVar9 = *pdVar1;
        pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_10 - 1,local_10);
        local_60 = dVar9 * *pdVar1;
      }
      if (local_8c == 10) {
        local_28 = local_68 + local_28;
        for (local_a0 = local_14; dVar9 = local_68, (int)local_a0 <= (int)local_10;
            local_a0 = local_a0 + 1) {
          pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_a0,local_a0);
          *pdVar1 = *pdVar1 - dVar9;
        }
        pDVar8 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
        OpenMD::DynamicRectMatrix<double>::operator()(pDVar8,local_10,local_10 - 1);
        std::abs((int)pDVar8);
        pDVar8 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
        OpenMD::DynamicRectMatrix<double>::operator()(pDVar8,local_10 - 1,local_10 - 2);
        std::abs((int)pDVar8);
        local_48 = extraout_XMM0_Qa_05 + extraout_XMM0_Qa_06;
        local_70 = local_48 * 0.75;
        local_60 = local_48 * -0.4375 * local_48;
        local_68 = local_70;
      }
      if ((local_8c == 0x1e) &&
         (dVar9 = (local_70 - local_68) / 2.0, local_48 = dVar9 * dVar9 + local_60, 0.0 < local_48))
      {
        local_48 = sqrt(local_48);
        if (local_70 < local_68) {
          local_48 = -local_48;
        }
        local_48 = local_68 - local_60 / ((local_70 - local_68) / 2.0 + local_48);
        for (local_a4 = local_14; dVar9 = local_48, (int)local_a4 <= (int)local_10;
            local_a4 = local_a4 + 1) {
          pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_a4,local_a4);
          *pdVar1 = *pdVar1 - dVar9;
        }
        local_28 = local_48 + local_28;
        local_60 = 0.964;
        local_70 = 0.964;
        local_68 = 0.964;
      }
      local_8c = local_8c + 1;
      for (local_a8 = local_10 - 2; (int)local_90 <= (int)local_a8; local_a8 = local_a8 - 1) {
        pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_a8,local_a8);
        local_50 = *pdVar1;
        local_40 = local_68 - local_50;
        local_48 = local_70 - local_50;
        dVar11 = -local_60;
        dVar10 = local_40 * local_48;
        pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_a8 + 1,local_a8);
        dVar9 = *pdVar1;
        pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_a8,local_a8 + 1);
        local_30 = (dVar10 + dVar11) / dVar9 + *pdVar1;
        pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_a8 + 1,local_a8 + 1);
        local_38 = ((*pdVar1 - local_50) - local_40) - local_48;
        pDVar8 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
        pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()(pDVar8,local_a8 + 2,local_a8 + 1);
        local_40 = *pdVar1;
        iVar7 = (int)pDVar8;
        std::abs(iVar7);
        std::abs(iVar7);
        std::abs(iVar7);
        local_48 = extraout_XMM0_Qa_07 + extraout_XMM0_Qa_08 + extraout_XMM0_Qa_09;
        local_30 = local_30 / local_48;
        local_38 = local_38 / local_48;
        local_40 = local_40 / local_48;
        if (local_a8 == local_90) break;
        pDVar8 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
        OpenMD::DynamicRectMatrix<double>::operator()(pDVar8,local_a8,local_a8 - 1);
        iVar7 = (int)pDVar8;
        std::abs(iVar7);
        std::abs(iVar7);
        std::abs(iVar7);
        dVar9 = local_20;
        std::abs(iVar7);
        pDVar8 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
        OpenMD::DynamicRectMatrix<double>::operator()(pDVar8,local_a8 - 1,local_a8 - 1);
        iVar7 = (int)pDVar8;
        std::abs(iVar7);
        std::abs(iVar7);
        pDVar8 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
        OpenMD::DynamicRectMatrix<double>::operator()(pDVar8,local_a8 + 1,local_a8 + 1);
        std::abs((int)pDVar8);
        if (extraout_XMM0_Qa_10 * (extraout_XMM0_Qa_11 + extraout_XMM0_Qa_12) <
            dVar9 * extraout_XMM0_Qa_13 *
                    (extraout_XMM0_Qa_14 + extraout_XMM0_Qa_15 + extraout_XMM0_Qa_16)) break;
      }
      for (local_ac = local_a8 + 2; (int)local_ac <= (int)local_10; local_ac = local_ac + 1) {
        pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                           ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_ac,local_ac - 2);
        *pdVar1 = 0.0;
        if ((int)(local_a8 + 2) < (int)local_ac) {
          pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_ac,local_ac - 3);
          *pdVar1 = 0.0;
        }
      }
      for (local_b0 = local_a8; (int)local_b0 <= (int)(local_10 - 1); local_b0 = local_b0 + 1) {
        local_b4 = (uint)(local_b0 != local_10 - 1);
        if (local_b0 != local_a8) {
          pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                             ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_b0,local_b0 - 1);
          local_30 = *pdVar1;
          pDVar8 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
          pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()(pDVar8,local_b0 + 1,local_b0 - 1);
          iVar7 = (int)pDVar8;
          local_38 = *pdVar1;
          if (local_b4 == 0) {
            local_2d0 = 0.0;
          }
          else {
            pDVar8 = (DynamicRectMatrix<double> *)(in_RDI + 0x12);
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()(pDVar8,local_b0 + 2,local_b0 - 1)
            ;
            iVar7 = (int)pDVar8;
            local_2d0 = *pdVar1;
          }
          local_40 = local_2d0;
          std::abs(iVar7);
          std::abs(iVar7);
          std::abs(iVar7);
          local_68 = extraout_XMM0_Qa_17 + extraout_XMM0_Qa_18 + extraout_XMM0_Qa_19;
          if ((local_68 != 0.0) || (NAN(local_68))) {
            local_30 = local_30 / local_68;
            local_38 = local_38 / local_68;
            local_40 = local_40 / local_68;
          }
        }
        if ((local_68 == 0.0) && (!NAN(local_68))) break;
        local_48 = sqrt(local_40 * local_40 + local_30 * local_30 + local_38 * local_38);
        if (local_30 < 0.0) {
          local_48 = -local_48;
        }
        if ((local_48 != 0.0) || (NAN(local_48))) {
          if (local_b0 == local_a8) {
            if (local_90 != local_a8) {
              pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                 ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_b0,local_b0 - 1
                                 );
              dVar9 = *pdVar1;
              pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                 ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_b0,local_b0 - 1
                                 );
              *pdVar1 = -dVar9;
            }
          }
          else {
            dVar9 = -local_48 * local_68;
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_b0,local_b0 - 1);
            *pdVar1 = dVar9;
          }
          local_30 = local_30 + local_48;
          local_68 = local_30 / local_48;
          local_70 = local_38 / local_48;
          local_50 = local_40 / local_48;
          local_38 = local_38 / local_30;
          local_40 = local_40 / local_30;
          for (local_b8 = local_b0; (int)local_b8 < (int)local_c; local_b8 = local_b8 + 1) {
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_b0,local_b8);
            dVar10 = local_38;
            dVar9 = *pdVar1;
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_b0 + 1,local_b8);
            dVar11 = local_40;
            dVar9 = dVar10 * *pdVar1 + dVar9;
            local_30 = dVar9;
            if (local_b4 != 0) {
              pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                 ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_b0 + 2,local_b8
                                 );
              local_30 = dVar11 * *pdVar1 + dVar9;
              pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                 ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_b0 + 2,local_b8
                                 );
              dVar9 = *pdVar1;
              dVar11 = -local_30 * local_50;
              pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                 ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_b0 + 2,local_b8
                                 );
              *pdVar1 = dVar11 + dVar9;
            }
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_b0,local_b8);
            dVar9 = *pdVar1;
            dVar11 = -local_30 * local_68;
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_b0,local_b8);
            *pdVar1 = dVar11 + dVar9;
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_b0 + 1,local_b8);
            dVar9 = *pdVar1;
            dVar11 = -local_30 * local_70;
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_b0 + 1,local_b8);
            *pdVar1 = dVar11 + dVar9;
          }
          local_bc = 0;
          while( true ) {
            uVar12 = local_bc;
            local_c0 = local_b0 + 3;
            piVar5 = std::min<int>((int *)&local_10,&local_c0);
            dVar9 = local_68;
            if (*piVar5 < (int)uVar12) break;
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_bc,local_b0);
            dVar10 = local_70;
            dVar11 = *pdVar1;
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_bc,local_b0 + 1);
            vVar4 = local_50;
            dVar9 = dVar9 * dVar11 + dVar10 * *pdVar1;
            local_30 = dVar9;
            if (local_b4 != 0) {
              pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                 ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_bc,local_b0 + 2
                                 );
              local_30 = vVar4 * *pdVar1 + dVar9;
              pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                 ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_bc,local_b0 + 2
                                 );
              dVar9 = *pdVar1;
              dVar11 = -local_30 * local_40;
              pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                 ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_bc,local_b0 + 2
                                 );
              *pdVar1 = dVar11 + dVar9;
            }
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_bc,local_b0);
            dVar9 = *pdVar1 - local_30;
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_bc,local_b0);
            *pdVar1 = dVar9;
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_bc,local_b0 + 1);
            dVar9 = *pdVar1;
            dVar11 = -local_30 * local_38;
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0x12),local_bc,local_b0 + 1);
            *pdVar1 = dVar11 + dVar9;
            local_bc = local_bc + 1;
          }
          for (local_c4 = local_14; dVar9 = local_68, (int)local_c4 <= local_18;
              local_c4 = local_c4 + 1) {
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_c4,local_b0);
            dVar10 = local_70;
            dVar11 = *pdVar1;
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_c4,local_b0 + 1);
            vVar4 = local_50;
            dVar9 = dVar9 * dVar11 + dVar10 * *pdVar1;
            local_30 = dVar9;
            if (local_b4 != 0) {
              pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                 ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_c4,local_b0 + 2)
              ;
              local_30 = vVar4 * *pdVar1 + dVar9;
              pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                 ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_c4,local_b0 + 2)
              ;
              dVar9 = *pdVar1;
              dVar11 = -local_30 * local_40;
              pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                                 ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_c4,local_b0 + 2)
              ;
              *pdVar1 = dVar11 + dVar9;
            }
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_c4,local_b0);
            dVar9 = *pdVar1 - local_30;
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_c4,local_b0);
            *pdVar1 = dVar9;
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_c4,local_b0 + 1);
            dVar9 = *pdVar1;
            dVar11 = -local_30 * local_38;
            pdVar1 = OpenMD::DynamicRectMatrix<double>::operator()
                               ((DynamicRectMatrix<double> *)(in_RDI + 0xe),local_c4,local_b0 + 1);
            *pdVar1 = dVar11 + dVar9;
          }
        }
      }
    }
  } while( true );
}

Assistant:

void hqr2() {
      //  This is derived from the Algol procedure hqr2,
      //  by Martin and Wilkinson, Handbook for Auto. Comp.,
      //  Vol.ii-Linear Algebra, and the corresponding
      //  Fortran subroutine in EISPACK.

      // Initialize

      int nn       = this->n;
      int n        = nn - 1;
      int low      = 0;
      int high     = nn - 1;
      Real eps     = pow(2.0, -52.0);
      Real exshift = 0.0;
      Real p = 0, q = 0, r = 0, s = 0, z = 0, t, w, x, y;

      // Store roots isolated by balanc and compute matrix norm

      Real norm = 0.0;
      for (int i = 0; i < nn; i++) {
        if ((i < low) || (i > high)) {
          d(i) = H(i, i);
          e(i) = 0.0;
        }
        for (int j = max(i - 1, 0); j < nn; j++) {
          norm = norm + abs(H(i, j));
        }
      }

      // Outer loop over eigenvalue index

      int iter = 0;
      while (n >= low) {
        // Look for single small sub-diagonal element

        int l = n;
        while (l > low) {
          s = abs(H(l - 1, l - 1)) + abs(H(l, l));
          if (s == 0.0) { s = norm; }
          if (abs(H(l, l - 1)) < eps * s) { break; }
          l--;
        }

        // Check for convergence
        // One root found

        if (l == n) {
          H(n, n) = H(n, n) + exshift;
          d(n)    = H(n, n);
          e(n)    = 0.0;
          n--;
          iter = 0;

          // Two roots found

        } else if (l == n - 1) {
          w               = H(n, n - 1) * H(n - 1, n);
          p               = (H(n - 1, n - 1) - H(n, n)) / 2.0;
          q               = p * p + w;
          z               = sqrt(abs(q));
          H(n, n)         = H(n, n) + exshift;
          H(n - 1, n - 1) = H(n - 1, n - 1) + exshift;
          x               = H(n, n);

          // Real pair

          if (q >= 0) {
            if (p >= 0) {
              z = p + z;
            } else {
              z = p - z;
            }
            d(n - 1) = x + z;
            d(n)     = d(n - 1);
            if (z != 0.0) { d(n) = x - w / z; }
            e(n - 1) = 0.0;
            e(n)     = 0.0;
            x        = H(n, n - 1);
            s        = abs(x) + abs(z);
            p        = x / s;
            q        = z / s;
            r        = sqrt(p * p + q * q);
            p        = p / r;
            q        = q / r;

            // Row modification

            for (int j = n - 1; j < nn; j++) {
              z           = H(n - 1, j);
              H(n - 1, j) = q * z + p * H(n, j);
              H(n, j)     = q * H(n, j) - p * z;
            }

            // Column modification

            for (int i = 0; i <= n; i++) {
              z           = H(i, n - 1);
              H(i, n - 1) = q * z + p * H(i, n);
              H(i, n)     = q * H(i, n) - p * z;
            }

            // Accumulate transformations

            for (int i = low; i <= high; i++) {
              z           = V(i, n - 1);
              V(i, n - 1) = q * z + p * V(i, n);
              V(i, n)     = q * V(i, n) - p * z;
            }

            // Complex pair

          } else {
            d(n - 1) = x + p;
            d(n)     = x + p;
            e(n - 1) = z;
            e(n)     = -z;
          }
          n    = n - 2;
          iter = 0;

          // No convergence yet

        } else {
          // Form shift

          x = H(n, n);
          y = 0.0;
          w = 0.0;
          if (l < n) {
            y = H(n - 1, n - 1);
            w = H(n, n - 1) * H(n - 1, n);
          }

          // Wilkinson's original ad hoc shift

          if (iter == 10) {
            exshift += x;
            for (int i = low; i <= n; i++) {
              H(i, i) -= x;
            }
            s = abs(H(n, n - 1)) + abs(H(n - 1, n - 2));
            x = y = 0.75 * s;
            w     = -0.4375 * s * s;
          }

          // MATLAB's new ad hoc shift

          if (iter == 30) {
            s = (y - x) / 2.0;
            s = s * s + w;
            if (s > 0) {
              s = sqrt(s);
              if (y < x) { s = -s; }
              s = x - w / ((y - x) / 2.0 + s);
              for (int i = low; i <= n; i++) {
                H(i, i) -= s;
              }
              exshift += s;
              x = y = w = 0.964;
            }
          }

          iter = iter + 1;  // (Could check iteration count here.)

          // Look for two consecutive small sub-diagonal elements

          int m = n - 2;
          while (m >= l) {
            z = H(m, m);
            r = x - z;
            s = y - z;
            p = (r * s - w) / H(m + 1, m) + H(m, m + 1);
            q = H(m + 1, m + 1) - z - r - s;
            r = H(m + 2, m + 1);
            s = abs(p) + abs(q) + abs(r);
            p = p / s;
            q = q / s;
            r = r / s;
            if (m == l) { break; }
            if (abs(H(m, m - 1)) * (abs(q) + abs(r)) <
                eps * (abs(p) * (abs(H(m - 1, m - 1)) + abs(z) +
                                 abs(H(m + 1, m + 1))))) {
              break;
            }
            m--;
          }

          for (int i = m + 2; i <= n; i++) {
            H(i, i - 2) = 0.0;
            if (i > m + 2) { H(i, i - 3) = 0.0; }
          }

          // Double QR step involving rows l:n and columns m:n

          for (int k = m; k <= n - 1; k++) {
            int notlast = (k != n - 1);
            if (k != m) {
              p = H(k, k - 1);
              q = H(k + 1, k - 1);
              r = (notlast ? H(k + 2, k - 1) : 0.0);
              x = abs(p) + abs(q) + abs(r);
              if (x != 0.0) {
                p = p / x;
                q = q / x;
                r = r / x;
              }
            }
            if (x == 0.0) { break; }
            s = sqrt(p * p + q * q + r * r);
            if (p < 0) { s = -s; }
            if (s != 0) {
              if (k != m) {
                H(k, k - 1) = -s * x;
              } else if (l != m) {
                H(k, k - 1) = -H(k, k - 1);
              }
              p = p + s;
              x = p / s;
              y = q / s;
              z = r / s;
              q = q / p;
              r = r / p;

              // Row modification

              for (int j = k; j < nn; j++) {
                p = H(k, j) + q * H(k + 1, j);
                if (notlast) {
                  p           = p + r * H(k + 2, j);
                  H(k + 2, j) = H(k + 2, j) - p * z;
                }
                H(k, j)     = H(k, j) - p * x;
                H(k + 1, j) = H(k + 1, j) - p * y;
              }

              // Column modification

              for (int i = 0; i <= min(n, k + 3); i++) {
                p = x * H(i, k) + y * H(i, k + 1);
                if (notlast) {
                  p           = p + z * H(i, k + 2);
                  H(i, k + 2) = H(i, k + 2) - p * r;
                }
                H(i, k)     = H(i, k) - p;
                H(i, k + 1) = H(i, k + 1) - p * q;
              }

              // Accumulate transformations

              for (int i = low; i <= high; i++) {
                p = x * V(i, k) + y * V(i, k + 1);
                if (notlast) {
                  p           = p + z * V(i, k + 2);
                  V(i, k + 2) = V(i, k + 2) - p * r;
                }
                V(i, k)     = V(i, k) - p;
                V(i, k + 1) = V(i, k + 1) - p * q;
              }
            }  // (s != 0)
          }    // k loop
        }      // check convergence
      }        // while (n >= low)

      // Backsubstitute to find vectors of upper triangular form

      if (norm == 0.0) { return; }

      for (n = nn - 1; n >= 0; n--) {
        p = d(n);
        q = e(n);

        // Real vector

        if (q == 0) {
          int l   = n;
          H(n, n) = 1.0;
          for (int i = n - 1; i >= 0; i--) {
            w = H(i, i) - p;
            r = 0.0;
            for (int j = l; j <= n; j++) {
              r = r + H(i, j) * H(j, n);
            }
            if (e(i) < 0.0) {
              z = w;
              s = r;
            } else {
              l = i;
              if (e(i) == 0.0) {
                if (w != 0.0) {
                  H(i, n) = -r / w;
                } else {
                  H(i, n) = -r / (eps * norm);
                }

                // Solve real equations

              } else {
                x       = H(i, i + 1);
                y       = H(i + 1, i);
                q       = (d(i) - p) * (d(i) - p) + e(i) * e(i);
                t       = (x * s - z * r) / q;
                H(i, n) = t;
                if (abs(x) > abs(z)) {
                  H(i + 1, n) = (-r - w * t) / x;
                } else {
                  H(i + 1, n) = (-s - y * t) / z;
                }
              }

              // Overflow control

              t = abs(H(i, n));
              if ((eps * t) * t > 1) {
                for (int j = i; j <= n; j++) {
                  H(j, n) = H(j, n) / t;
                }
              }
            }
          }

          // Complex vector

        } else if (q < 0) {
          int l = n - 1;

          // Last vector component imaginary so matrix is triangular

          if (abs(H(n, n - 1)) > abs(H(n - 1, n))) {
            H(n - 1, n - 1) = q / H(n, n - 1);
            H(n - 1, n)     = -(H(n, n) - p) / H(n, n - 1);
          } else {
            cdiv(0.0, -H(n - 1, n), H(n - 1, n - 1) - p, q);
            H(n - 1, n - 1) = cdivr;
            H(n - 1, n)     = cdivi;
          }
          H(n, n - 1) = 0.0;
          H(n, n)     = 1.0;
          for (int i = n - 2; i >= 0; i--) {
            Real ra, sa, vr, vi;
            ra = 0.0;
            sa = 0.0;
            for (int j = l; j <= n; j++) {
              ra = ra + H(i, j) * H(j, n - 1);
              sa = sa + H(i, j) * H(j, n);
            }
            w = H(i, i) - p;

            if (e(i) < 0.0) {
              z = w;
              r = ra;
              s = sa;
            } else {
              l = i;
              if (e(i) == 0) {
                cdiv(-ra, -sa, w, q);
                H(i, n - 1) = cdivr;
                H(i, n)     = cdivi;
              } else {
                // Solve complex equations

                x  = H(i, i + 1);
                y  = H(i + 1, i);
                vr = (d(i) - p) * (d(i) - p) + e(i) * e(i) - q * q;
                vi = (d(i) - p) * 2.0 * q;
                if ((vr == 0.0) && (vi == 0.0)) {
                  vr =
                      eps * norm * (abs(w) + abs(q) + abs(x) + abs(y) + abs(z));
                }
                cdiv(x * r - z * ra + q * sa, x * s - z * sa - q * ra, vr, vi);
                H(i, n - 1) = cdivr;
                H(i, n)     = cdivi;
                if (abs(x) > (abs(z) + abs(q))) {
                  H(i + 1, n - 1) = (-ra - w * H(i, n - 1) + q * H(i, n)) / x;
                  H(i + 1, n)     = (-sa - w * H(i, n) - q * H(i, n - 1)) / x;
                } else {
                  cdiv(-r - y * H(i, n - 1), -s - y * H(i, n), z, q);
                  H(i + 1, n - 1) = cdivr;
                  H(i + 1, n)     = cdivi;
                }
              }

              // Overflow control

              t = max(abs(H(i, n - 1)), abs(H(i, n)));
              if ((eps * t) * t > 1) {
                for (int j = i; j <= n; j++) {
                  H(j, n - 1) = H(j, n - 1) / t;
                  H(j, n)     = H(j, n) / t;
                }
              }
            }
          }
        }
      }

      // Vectors of isolated roots

      for (int i = 0; i < nn; i++) {
        if (i < low || i > high) {
          for (int j = i; j < nn; j++) {
            V(i, j) = H(i, j);
          }
        }
      }

      // Back transformation to get eigenvectors of original matrix

      for (int j = nn - 1; j >= low; j--) {
        for (int i = low; i <= high; i++) {
          z = 0.0;
          for (int k = low; k <= min(j, high); k++) {
            z = z + V(i, k) * H(k, j);
          }
          V(i, j) = z;
        }
      }
    }